

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 *puVar5;
  byte in_CL;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  uint in_EDI;
  undefined1 (*in_R8) [16];
  uint in_R9D;
  uint32_t output [4];
  uint8_t *imageXEnd_1;
  uint8_t *imageX;
  simd sumLoHi;
  simd dataHi_1;
  simd dataLo_1;
  simd data_5;
  simd simdSum;
  simd *srcEnd;
  simd *src_1;
  uint8_t *imageYEnd_1;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint8_t *imageXEnd;
  simd data_4;
  simd data_3;
  simd data_2;
  simd data_1;
  simd dataHi;
  simd dataLo;
  simd data;
  simd *src;
  simd *dst;
  simd simdSum_4;
  simd simdSum_3;
  simd simdSum_2;
  simd simdSum_1;
  uint8_t *imageSimdYEnd;
  uint8_t *imageSimdY;
  uint8_t *imageSimdXEnd;
  simd zero;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  byte *local_588;
  byte *local_580;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined8 local_548;
  undefined8 uStack_540;
  undefined1 local_538 [16];
  undefined1 (*local_528) [16];
  undefined1 (*local_520) [16];
  undefined1 (*local_518) [16];
  undefined1 (*local_508) [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 (*local_428) [16];
  undefined8 local_418;
  undefined8 uStack_410;
  uint local_3fc;
  undefined1 (*local_3f8) [16];
  undefined1 local_3ed;
  undefined1 (*local_3e8) [16];
  uint local_3dc;
  undefined1 (*local_3d8) [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_308 [16];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_2b8 = (undefined1  [16])0x0;
  local_418 = 0;
  uStack_410 = 0;
  local_3f8 = in_R8;
  local_3e8 = in_RSI;
  if ((in_CL & 1) == 0) {
    local_518 = (undefined1 (*) [16])(*in_RSI + in_EDX * in_EDI);
    local_3ed = 0;
    local_3fc = in_R9D;
    local_3dc = in_EDI;
    for (; local_3e8 != local_518; local_3e8 = (undefined1 (*) [16])(*local_3e8 + local_3dc)) {
      local_528 = local_3e8 + local_3fc;
      local_308 = (undefined1  [16])0x0;
      local_538 = ZEXT816(0);
      for (local_520 = local_3e8; local_520 != local_528; local_520 = local_520 + 1) {
        local_3d8 = local_520;
        local_548 = *(undefined8 *)*local_520;
        uStack_540 = *(undefined8 *)(*local_520 + 8);
        local_2a8 = local_418;
        uStack_2a0 = uStack_410;
        auVar1._8_8_ = uStack_410;
        auVar1._0_8_ = local_418;
        local_558 = vpunpcklbw_avx(*local_520,auVar1);
        local_268 = local_418;
        uStack_260 = uStack_410;
        auVar2._8_8_ = uStack_410;
        auVar2._0_8_ = local_418;
        local_568 = vpunpckhbw_avx(*local_520,auVar2);
        local_18 = local_558._0_8_;
        uStack_10 = local_558._8_8_;
        local_28 = local_568._0_8_;
        uStack_20 = local_568._8_8_;
        local_578 = vpaddw_avx(local_558,local_568);
        local_158 = local_538._0_8_;
        uStack_150 = local_538._8_8_;
        local_218 = local_578._0_8_;
        uStack_210 = local_578._8_8_;
        local_228 = local_418;
        uStack_220 = uStack_410;
        auVar3._8_8_ = uStack_410;
        auVar3._0_8_ = local_418;
        local_138 = vpunpcklwd_avx(local_578,auVar3);
        local_1b8 = local_578._0_8_;
        uStack_1b0 = local_578._8_8_;
        local_1c8 = local_418;
        uStack_1c0 = uStack_410;
        auVar4._8_8_ = uStack_410;
        auVar4._0_8_ = local_418;
        local_148 = vpunpckhwd_avx(local_578,auVar4);
        local_168 = vpaddd_avx(local_138,local_148);
        local_538 = vpaddd_avx(local_538,local_168);
        local_298 = local_548;
        uStack_290 = uStack_540;
        local_258 = local_548;
        uStack_250 = uStack_540;
      }
      if ((uint)imageXEnd_1 != 0) {
        local_580 = *local_3e8 + output[2];
        local_588 = local_580 + (uint)imageXEnd_1;
        for (; local_580 != local_588; local_580 = local_580 + 1) {
          *(uint *)*local_3f8 = (uint)*local_580 + *(int *)*local_3f8;
        }
      }
      memset(&local_598,0,0x10);
      local_3a8 = local_538._0_8_;
      uStack_3a0 = local_538._8_8_;
      iStack_594 = local_538._4_4_;
      local_598 = local_538._0_4_;
      iStack_58c = local_538._12_4_;
      iStack_590 = local_538._8_4_;
      *(int *)*local_3f8 = local_598 + iStack_594 + iStack_590 + iStack_58c + *(int *)*local_3f8;
      local_3f8 = (undefined1 (*) [16])(*local_3f8 + 4);
      local_390 = (undefined1 *)&local_598;
    }
  }
  else {
    for (; local_3e8 != (undefined1 (*) [16])(*in_RSI + output[2]); local_3e8 = local_3e8 + 1) {
      local_448 = ZEXT816(0);
      local_458 = ZEXT816(0);
      local_468 = ZEXT816(0);
      local_478 = ZEXT816(0);
      for (local_428 = local_3e8; local_428 != (undefined1 (*) [16])(*local_3e8 + in_EDX * in_EDI);
          local_428 = (undefined1 (*) [16])(*local_428 + in_EDI)) {
        auVar2 = vpunpcklbw_avx(*local_428,ZEXT816(0));
        auVar1 = vpunpckhbw_avx(*local_428,ZEXT816(0));
        auVar3 = vpunpcklwd_avx(auVar2,ZEXT816(0));
        auVar2 = vpunpckhwd_avx(auVar2,ZEXT816(0));
        auVar4 = vpunpcklwd_avx(auVar1,ZEXT816(0));
        auVar1 = vpunpckhwd_avx(auVar1,ZEXT816(0));
        local_448 = vpaddd_avx(auVar3,local_448);
        local_458 = vpaddd_avx(auVar2,local_458);
        local_468 = vpaddd_avx(auVar4,local_468);
        local_478 = vpaddd_avx(auVar1,local_478);
      }
      auVar1 = vpaddd_avx(local_448,*local_3f8);
      local_328 = auVar1._0_8_;
      uStack_320 = auVar1._8_8_;
      *(undefined8 *)*local_3f8 = local_328;
      *(undefined8 *)(*local_3f8 + 8) = uStack_320;
      auVar1 = vpaddd_avx(local_458,local_3f8[1]);
      local_348 = auVar1._0_8_;
      uStack_340 = auVar1._8_8_;
      *(undefined8 *)local_3f8[1] = local_348;
      *(undefined8 *)(local_3f8[1] + 8) = uStack_340;
      auVar1 = vpaddd_avx(local_468,local_3f8[2]);
      local_368 = auVar1._0_8_;
      uStack_360 = auVar1._8_8_;
      *(undefined8 *)local_3f8[2] = local_368;
      *(undefined8 *)(local_3f8[2] + 8) = uStack_360;
      auVar1 = vpaddd_avx(local_478,local_3f8[3]);
      local_388 = auVar1._0_8_;
      uStack_380 = auVar1._8_8_;
      *(undefined8 *)local_3f8[3] = local_388;
      *(undefined8 *)(local_3f8[3] + 8) = uStack_380;
      local_3f8 = local_3f8 + 4;
    }
    if ((uint)imageXEnd_1 != 0) {
      puVar5 = *local_3e8;
      for (; local_3e8 != (undefined1 (*) [16])(puVar5 + (uint)imageXEnd_1);
          local_3e8 = (undefined1 (*) [16])(*local_3e8 + 1)) {
        for (local_508 = local_3e8; local_508 != (undefined1 (*) [16])(*local_3e8 + in_EDX * in_EDI)
            ; local_508 = (undefined1 (*) [16])(*local_508 + in_EDI)) {
          *(uint *)*local_3f8 = (uint)(byte)(*local_508)[0] + *(int *)*local_3f8;
        }
        local_3f8 = (undefined1 (*) [16])(*local_3f8 + 4);
      }
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm_setzero_si128();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY    = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm_setzero_si128();
                simd simdSum_2 = _mm_setzero_si128();
                simd simdSum_3 = _mm_setzero_si128();
                simd simdSum_4 = _mm_setzero_si128();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm_loadu_si128( src );

                    const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm_add_epi32( data_4, simdSum_4 );
                }

                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_4, _mm_loadu_si128( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm_setzero_si128();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm_loadu_si128( src );

                    simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                    simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                     _mm_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[4] = { 0 };
                _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3];
            }
        }
    }